

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

int __thiscall soplex::SPxSteepPR<double>::selectLeaveX(SPxSteepPR<double> *this,double tol)

{
  double dVar1;
  double dVar2;
  SPxSolverBase<double> *pSVar3;
  pointer pdVar4;
  pointer pdVar5;
  bool bVar6;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  pdVar4 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (pSVar3->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  ::soplex::infinity::__tls_init();
  uVar9 = (ulong)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
  if ((long)uVar9 < 1) {
    iVar7 = -1;
  }
  else {
    pdVar8 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar10 = -*pdVar8;
    iVar7 = -1;
    do {
      dVar1 = pdVar4[uVar9 - 1];
      if (dVar1 < -tol) {
        dVar2 = pdVar5[uVar9 - 1];
        dVar11 = tol;
        if (tol <= dVar2) {
          dVar11 = dVar2;
        }
        dVar11 = (dVar1 * dVar1) / dVar11;
        if (dVar10 < dVar11) {
          iVar7 = (int)uVar9 + -1;
          dVar10 = dVar11;
        }
      }
      bVar6 = 1 < uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar6);
  }
  return iVar7;
}

Assistant:

int SPxSteepPR<R>::selectLeaveX(R tol)
{
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   const R* fTest         = this->thesolver->fTest().get_const_ptr();
   R best = R(-infinity);
   R x;
   int lastIdx = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = fTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            lastIdx = i;
         }
      }
   }

   return lastIdx;
}